

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

Matrix * TRM::lookAt(Matrix *__return_storage_ptr__,Vec3f eye,Vec3f center,Vec3f up)

{
  vec<3,_float,_(glm::qualifier)0> *in_R8;
  undefined1 local_54 [8];
  Vec3f up_local;
  undefined1 local_38 [8];
  Vec3f center_local;
  undefined8 local_18;
  Vec3f eye_local;
  
  up_local.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)up.field_2;
  local_54 = up._0_8_;
  center_local.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)center.field_2;
  up_local._4_8_ = center._0_8_;
  eye_local.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)eye.field_2;
  register0x00001200 = eye._0_8_;
  local_38 = (undefined1  [8])up_local._4_8_;
  local_18 = register0x00001200;
  glm::lookAt<float,(glm::qualifier)0>
            (__return_storage_ptr__,(glm *)&local_18,(vec<3,_float,_(glm::qualifier)0> *)local_38,
             (vec<3,_float,_(glm::qualifier)0> *)local_54,in_R8);
  return __return_storage_ptr__;
}

Assistant:

Matrix lookAt(Vec3f eye, Vec3f center, Vec3f up) {
  return glm::lookAt(eye, center, up);
}